

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONValue.cpp
# Opt level: O2

JSONValue * JSONValue::Parse(wchar_t **data)

{
  wchar_t *pwVar1;
  size_type *psVar2;
  wchar_t wVar3;
  JSONValue *this;
  double dVar4;
  bool bVar5;
  int iVar6;
  wchar_t wVar7;
  JSONValue *pJVar8;
  JSONValue *pJVar9;
  iterator iVar10;
  mapped_type *ppJVar11;
  undefined8 uVar12;
  _Self __tmp;
  _Self __tmp_1;
  wchar_t *pwVar13;
  _Alloc_hider _Var14;
  double i;
  double dVar15;
  double dVar16;
  wstring str;
  wstring name;
  
  pwVar13 = *data;
  if (*pwVar13 == L'\"') {
    str._M_dataplus._M_p = (pointer)&str.field_2;
    str._M_string_length = 0;
    str.field_2._M_allocated_capacity = str.field_2._M_allocated_capacity & 0xffffffff00000000;
    *data = pwVar13 + 1;
    bVar5 = JSON::ExtractString(data,&str);
    if (bVar5) {
      pJVar8 = (JSONValue *)operator_new(0x10);
      JSONValue(pJVar8,&str);
    }
    else {
      pJVar8 = (JSONValue *)0x0;
    }
    std::__cxx11::wstring::~wstring((wstring *)&str);
    return pJVar8;
  }
  bVar5 = simplejson_wcsnlen(pwVar13,4);
  if (bVar5) {
    iVar6 = wcsncasecmp(pwVar13,L"true",4);
    if (iVar6 == 0) goto LAB_00179421;
    pwVar13 = *data;
  }
  bVar5 = simplejson_wcsnlen(pwVar13,5);
  if (bVar5) {
    iVar6 = wcsncasecmp(pwVar13,L"false",5);
    if (iVar6 == 0) {
LAB_00179421:
      iVar6 = wcsncasecmp(*data,L"true",4);
      *data = (wchar_t *)((long)*data + (ulong)((iVar6 == 0 ^ 5) << 2));
      pJVar8 = (JSONValue *)operator_new(0x10);
      pJVar8->type = JSONType_Bool;
      (pJVar8->field_1).bool_value = iVar6 == 0;
      return pJVar8;
    }
    pwVar13 = *data;
  }
  bVar5 = simplejson_wcsnlen(pwVar13,4);
  if (bVar5) {
    iVar6 = wcsncasecmp(pwVar13,L"null",4);
    pwVar13 = *data;
    if (iVar6 == 0) {
      *data = pwVar13 + 4;
      pJVar8 = (JSONValue *)operator_new(0x10);
      pJVar8->type = JSONType_Null;
      return pJVar8;
    }
  }
  wVar3 = *pwVar13;
  if (wVar3 == L'-') {
    *data = pwVar13 + 1;
    pwVar1 = pwVar13 + 1;
    pwVar13 = pwVar13 + 1;
    wVar7 = *pwVar1;
LAB_00179471:
    if (wVar7 == L'0') {
      pwVar13 = pwVar13 + 1;
      *data = pwVar13;
      dVar16 = 0.0;
    }
    else {
      if (8 < (uint)(wVar7 + L'\xffffffcf')) goto LAB_0017987d;
      dVar16 = JSON::ParseInt(data);
      pwVar13 = *data;
    }
    wVar7 = *pwVar13;
    if (wVar7 == L'.') {
      *data = pwVar13 + 1;
      if (9 < (uint)(pwVar13[1] + L'\xffffffd0')) goto LAB_0017987d;
      dVar4 = JSON::ParseDecimal(data);
      dVar16 = dVar16 + dVar4;
      pwVar13 = *data;
      wVar7 = *pwVar13;
    }
    if ((wVar7 | 0x20U) == 0x65) {
      *data = pwVar13 + 1;
      wVar7 = pwVar13[1];
      if ((wVar7 == L'-') || (wVar7 == L'+')) {
        bVar5 = wVar7 == L'-';
        *data = pwVar13 + 2;
        wVar7 = pwVar13[2];
      }
      else {
        bVar5 = false;
      }
      if (9 < (uint)(wVar7 + L'\xffffffd0')) goto LAB_0017987d;
      dVar4 = JSON::ParseInt(data);
      for (dVar15 = 0.0; dVar15 < dVar4; dVar15 = dVar15 + 1.0) {
        if (bVar5) {
          dVar16 = dVar16 / 10.0;
        }
        else {
          dVar16 = dVar16 * 10.0;
        }
      }
    }
    if (wVar3 == L'-') {
      dVar16 = -dVar16;
    }
    pJVar8 = (JSONValue *)operator_new(0x10);
    pJVar8->type = JSONType_Number;
    (pJVar8->field_1).number_value = dVar16;
  }
  else {
    wVar7 = wVar3;
    if ((uint)(wVar3 + L'\xffffffd0') < 10) goto LAB_00179471;
    if (wVar3 == L'[') {
      str.field_2._M_allocated_capacity = 0;
      str._M_dataplus._M_p = (pointer)0x0;
      str._M_string_length = 0;
      pwVar13 = pwVar13 + 1;
      *data = pwVar13;
      do {
        if (*pwVar13 == L'\0') {
          pJVar8 = (JSONValue *)0x0;
          for (_Var14._M_p = str._M_dataplus._M_p; _Var14._M_p != (pointer)str._M_string_length;
              _Var14._M_p = _Var14._M_p + 2) {
            pJVar9 = *(JSONValue **)_Var14._M_p;
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
            }
            operator_delete(pJVar9);
          }
LAB_00179b15:
          std::_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_>::~_Vector_base
                    ((_Vector_base<JSONValue_*,_std::allocator<JSONValue_*>_> *)&str);
          return pJVar8;
        }
        bVar5 = JSON::SkipWhitespace(data);
        if (!bVar5) {
          pJVar8 = (JSONValue *)0x0;
          for (_Var14 = str._M_dataplus; _Var14._M_p != (pointer)str._M_string_length;
              _Var14._M_p = _Var14._M_p + 2) {
            pJVar9 = *(JSONValue **)_Var14._M_p;
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
            }
            operator_delete(pJVar9);
          }
          goto LAB_00179b15;
        }
        if (((pointer)str._M_string_length == str._M_dataplus._M_p) && (**data == L']')) {
          *data = *data + 1;
          pJVar8 = (JSONValue *)operator_new(0x10);
          JSONValue(pJVar8,(JSONArray *)&str);
          goto LAB_00179b15;
        }
        name._M_dataplus._M_p = (pointer)Parse(data);
        if ((JSONValue *)name._M_dataplus._M_p == (JSONValue *)0x0) {
          pJVar8 = (JSONValue *)0x0;
          for (_Var14 = str._M_dataplus; _Var14._M_p != (pointer)str._M_string_length;
              _Var14._M_p = _Var14._M_p + 2) {
            pJVar9 = *(JSONValue **)_Var14._M_p;
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
            }
            operator_delete(pJVar9);
          }
          goto LAB_00179b15;
        }
        std::vector<JSONValue_*,_std::allocator<JSONValue_*>_>::push_back
                  ((vector<JSONValue_*,_std::allocator<JSONValue_*>_> *)&str,(value_type *)&name);
        bVar5 = JSON::SkipWhitespace(data);
        if (!bVar5) {
          pJVar8 = (JSONValue *)0x0;
          for (_Var14 = str._M_dataplus; _Var14._M_p != (pointer)str._M_string_length;
              _Var14._M_p = _Var14._M_p + 2) {
            pJVar9 = *(JSONValue **)_Var14._M_p;
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
            }
            operator_delete(pJVar9);
          }
          goto LAB_00179b15;
        }
        pwVar13 = *data;
        if (*pwVar13 != L',') {
          if (*pwVar13 == L']') {
            *data = pwVar13 + 1;
            pJVar8 = (JSONValue *)operator_new(0x10);
            JSONValue(pJVar8,(JSONArray *)&str);
          }
          else {
            pJVar8 = (JSONValue *)0x0;
            for (_Var14 = str._M_dataplus; _Var14._M_p != (pointer)str._M_string_length;
                _Var14._M_p = _Var14._M_p + 2) {
              pJVar9 = *(JSONValue **)_Var14._M_p;
              if (pJVar9 != (JSONValue *)0x0) {
                ~JSONValue(pJVar9);
              }
              operator_delete(pJVar9);
            }
          }
          goto LAB_00179b15;
        }
        pwVar13 = pwVar13 + 1;
        *data = pwVar13;
      } while( true );
    }
    if (wVar3 == L'{') {
      psVar2 = &str._M_string_length;
      str._M_string_length = (ulong)str._M_string_length._4_4_ << 0x20;
      str.field_2._M_allocated_capacity = 0;
      pJVar8 = (JSONValue *)(pwVar13 + 1);
      *data = (wchar_t *)pJVar8;
      str.field_2._8_8_ = psVar2;
      while (**data != L'\0') {
        bVar5 = JSON::SkipWhitespace(data);
        if (!bVar5) {
          pJVar8 = (JSONValue *)0x0;
          for (uVar12 = str.field_2._8_8_; (size_type *)uVar12 != psVar2;
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
            pJVar9 = *(JSONValue **)(uVar12 + 0x40);
            if (pJVar9 != (JSONValue *)0x0) {
              ~JSONValue(pJVar9);
            }
            operator_delete(pJVar9);
          }
          goto LAB_00179aee;
        }
        pwVar13 = *data;
        if (*pwVar13 == L'}') {
          *data = pwVar13 + 1;
          pJVar8 = (JSONValue *)operator_new(0x10);
          JSONValue(pJVar8,(JSONObject *)&str);
          goto LAB_00179aee;
        }
        name._M_dataplus._M_p = (pointer)&name.field_2;
        name._M_string_length = 0;
        name.field_2._M_local_buf[0] = L'\0';
        *data = pwVar13 + 1;
        bVar5 = JSON::ExtractString(data,&name);
        uVar12 = str.field_2._8_8_;
        if (bVar5) {
          bVar5 = JSON::SkipWhitespace(data);
          uVar12 = str.field_2._8_8_;
          if (!bVar5) {
            for (; (size_type *)uVar12 != psVar2;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar8 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar8 != (JSONValue *)0x0) {
                ~JSONValue(pJVar8);
              }
              operator_delete(pJVar8);
            }
            goto LAB_001797fa;
          }
          pwVar13 = *data;
          *data = pwVar13 + 1;
          if (*pwVar13 != L':') {
            for (; (size_type *)uVar12 != psVar2;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar8 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar8 != (JSONValue *)0x0) {
                ~JSONValue(pJVar8);
              }
              operator_delete(pJVar8);
            }
            goto LAB_001797fa;
          }
          bVar5 = JSON::SkipWhitespace(data);
          uVar12 = str.field_2._8_8_;
          if (!bVar5) {
            for (; (size_type *)uVar12 != psVar2;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar8 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar8 != (JSONValue *)0x0) {
                ~JSONValue(pJVar8);
              }
              operator_delete(pJVar8);
            }
            goto LAB_001797fa;
          }
          pJVar9 = Parse(data);
          uVar12 = str.field_2._8_8_;
          if (pJVar9 == (JSONValue *)0x0) {
            for (; (size_type *)uVar12 != psVar2;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar8 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar8 != (JSONValue *)0x0) {
                ~JSONValue(pJVar8);
              }
              operator_delete(pJVar8);
            }
            goto LAB_001797fa;
          }
          iVar10 = std::
                   _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                   ::find((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                           *)&str,&name);
          if (iVar10._M_node != (_Base_ptr)psVar2) {
            ppJVar11 = std::
                       map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                       ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                     *)&str,&name);
            this = *ppJVar11;
            if (this != (JSONValue *)0x0) {
              ~JSONValue(this);
            }
            operator_delete(this);
          }
          ppJVar11 = std::
                     map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                                   *)&str,&name);
          *ppJVar11 = pJVar9;
          bVar5 = JSON::SkipWhitespace(data);
          uVar12 = str.field_2._8_8_;
          if (!bVar5) {
            for (; (size_type *)uVar12 != psVar2;
                uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
              pJVar8 = *(JSONValue **)(uVar12 + 0x40);
              if (pJVar8 != (JSONValue *)0x0) {
                ~JSONValue(pJVar8);
              }
              operator_delete(pJVar8);
            }
            goto LAB_001797fa;
          }
          pwVar13 = *data;
          if (*pwVar13 == L',') {
            *data = pwVar13 + 1;
            bVar5 = true;
          }
          else {
            if (*pwVar13 != L'}') {
              for (; (size_type *)uVar12 != psVar2;
                  uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
                pJVar8 = *(JSONValue **)(uVar12 + 0x40);
                if (pJVar8 != (JSONValue *)0x0) {
                  ~JSONValue(pJVar8);
                }
                operator_delete(pJVar8);
              }
              goto LAB_001797fa;
            }
            *data = pwVar13 + 1;
            pJVar8 = (JSONValue *)operator_new(0x10);
            JSONValue(pJVar8,(JSONObject *)&str);
            bVar5 = false;
          }
        }
        else {
          for (; (size_type *)uVar12 != psVar2;
              uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
            pJVar8 = *(JSONValue **)(uVar12 + 0x40);
            if (pJVar8 != (JSONValue *)0x0) {
              ~JSONValue(pJVar8);
            }
            operator_delete(pJVar8);
          }
LAB_001797fa:
          bVar5 = false;
          pJVar8 = (JSONValue *)0x0;
        }
        std::__cxx11::wstring::~wstring((wstring *)&name);
        if (!bVar5) goto LAB_00179aee;
      }
      pJVar8 = (JSONValue *)0x0;
      for (uVar12 = str.field_2._8_8_; (size_type *)uVar12 != psVar2;
          uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12)) {
        pJVar9 = *(JSONValue **)(uVar12 + 0x40);
        if (pJVar9 != (JSONValue *)0x0) {
          ~JSONValue(pJVar9);
        }
        operator_delete(pJVar9);
      }
LAB_00179aee:
      std::
      _Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>,_std::less<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_JSONValue_*>_>_>
                   *)&str);
      return pJVar8;
    }
LAB_0017987d:
    pJVar8 = (JSONValue *)0x0;
  }
  return pJVar8;
}

Assistant:

JSONValue *JSONValue::Parse(const wchar_t **data)
{
	// Is it a string?
	if (**data == '"')
	{
		std::wstring str;
		if (!JSON::ExtractString(&(++(*data)), str))
			return NULL;
		else
			return new JSONValue(str);
	}

	// Is it a boolean?
	else if ((simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"true", 4) == 0) || (simplejson_wcsnlen(*data, 5) && wcsncasecmp(*data, L"false", 5) == 0))
	{
		bool value = wcsncasecmp(*data, L"true", 4) == 0;
		(*data) += value ? 4 : 5;
		return new JSONValue(value);
	}

	// Is it a null?
	else if (simplejson_wcsnlen(*data, 4) && wcsncasecmp(*data, L"null", 4) == 0)
	{
		(*data) += 4;
		return new JSONValue();
	}

	// Is it a number?
	else if (**data == L'-' || (**data >= L'0' && **data <= L'9'))
	{
		// Negative?
		bool neg = **data == L'-';
		if (neg) (*data)++;

		double number = 0.0;

		// Parse the whole part of the number - only if it wasn't 0
		if (**data == L'0')
			(*data)++;
		else if (**data >= L'1' && **data <= L'9')
			number = JSON::ParseInt(data);
		else
			return NULL;

		// Could be a decimal now...
		if (**data == '.')
		{
			(*data)++;

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Find the decimal and sort the decimal place out
			// Use ParseDecimal as ParseInt won't work with decimals less than 0.1
			// thanks to Javier Abadia for the report & fix
			double decimal = JSON::ParseDecimal(data);

			// Save the number
			number += decimal;
		}

		// Could be an exponent now...
		if (**data == L'E' || **data == L'e')
		{
			(*data)++;

			// Check signage of expo
			bool neg_expo = false;
			if (**data == L'-' || **data == L'+')
			{
				neg_expo = **data == L'-';
				(*data)++;
			}

			// Not get any digits?
			if (!(**data >= L'0' && **data <= L'9'))
				return NULL;

			// Sort the expo out
			double expo = JSON::ParseInt(data);
			for (double i = 0.0; i < expo; i++)
				number = neg_expo ? (number / 10.0) : (number * 10.0);
		}

		// Was it neg?
		if (neg) number *= -1;

		return new JSONValue(number);
	}

	// An object?
	else if (**data == L'{')
	{
		JSONObject object;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Special case - empty object
			if (object.size() == 0 && **data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// We want a string now...
			std::wstring name;
			if (!JSON::ExtractString(&(++(*data)), name))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Need a : now
			if (*((*data)++) != L':')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// The value is here
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// Add the name:value
			if (object.find(name) != object.end())
				delete object[name];
			object[name] = value;

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_OBJECT(object);
				return NULL;
			}

			// End of object?
			if (**data == L'}')
			{
				(*data)++;
				return new JSONValue(object);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_OBJECT(object);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_OBJECT(object);
		return NULL;
	}

	// An array?
	else if (**data == L'[')
	{
		JSONArray array;

		(*data)++;

		while (**data != 0)
		{
			// Whitespace at the start?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Special case - empty array
			if (array.size() == 0 && **data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Get the value
			JSONValue *value = Parse(data);
			if (value == NULL)
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// Add the value
			array.push_back(value);

			// More whitespace?
			if (!JSON::SkipWhitespace(data))
			{
				FREE_ARRAY(array);
				return NULL;
			}

			// End of array?
			if (**data == L']')
			{
				(*data)++;
				return new JSONValue(array);
			}

			// Want a , now
			if (**data != L',')
			{
				FREE_ARRAY(array);
				return NULL;
			}

			(*data)++;
		}

		// Only here if we ran out of data
		FREE_ARRAY(array);
		return NULL;
	}

	// Ran out of possibilites, it's bad!
	else
	{
		return NULL;
	}
}